

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::ReservoirQuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  vector<double,_true> *vec;
  optional_ptr<duckdb::FunctionData,_true> oVar1;
  optional_ptr<duckdb::FunctionData,_true> local_20;
  
  local_20.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_20);
  oVar1 = local_20;
  vec = (vector<double,_true> *)(local_20.ptr + 1);
  (*serializer->_vptr_Serializer[2])(serializer,100,"quantiles");
  Serializer::WriteValue<double>(serializer,vec);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"sample_size");
  (*serializer->_vptr_Serializer[0x15])(serializer,oVar1.ptr[4]._vptr_FunctionData);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
	                      const AggregateFunction &function) {
		auto &bind_data = bind_data_p->Cast<ReservoirQuantileBindData>();
		serializer.WriteProperty(100, "quantiles", bind_data.quantiles);
		serializer.WriteProperty(101, "sample_size", bind_data.sample_size);
	}